

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_lzmasdk.h
# Opt level: O0

SizeT IA64_Convert(Byte *data,SizeT size,UInt32 ip,int encoding)

{
  byte bVar1;
  int iVar2;
  ulong uVar3;
  byte bVar4;
  uint local_64;
  UInt32 dest;
  UInt32 src;
  int j;
  UInt64 instNorm;
  UInt64 instruction;
  UInt32 bitRes;
  UInt32 bytePos;
  int slot;
  UInt32 bitPos;
  UInt32 mask;
  UInt32 instrTemplate;
  SizeT i;
  int encoding_local;
  UInt32 ip_local;
  SizeT size_local;
  Byte *data_local;
  
  if (size < 0x10) {
    data_local = (Byte *)0x0;
  }
  else {
    for (_mask = (Byte *)0x0; _mask <= (Byte *)(size - 0x10); _mask = _mask + 0x10) {
      bVar1 = ""[data[(long)_mask] & 0x1f];
      bytePos = 5;
      for (bitRes = 0; (int)bitRes < 3; bitRes = bitRes + 1) {
        if ((bVar1 >> ((byte)bitRes & 0x1f) & 1) != 0) {
          bVar4 = (byte)bytePos & 7;
          instNorm = 0;
          for (dest = 0; (int)dest < 6; dest = dest + 1) {
            instNorm = ((ulong)data[(long)(_mask + (ulong)(bytePos >> 3) + (long)(int)dest)] <<
                       ((byte)(dest << 3) & 0x3f)) + instNorm;
          }
          uVar3 = instNorm >> bVar4;
          if (((uVar3 >> 0x25 & 0xf) == 5) && ((uVar3 >> 9 & 7) == 0)) {
            if (encoding == 0) {
              iVar2 = -(ip + (int)_mask);
            }
            else {
              iVar2 = ip + (int)_mask;
            }
            local_64 = iVar2 + (((uint)(uVar3 >> 0x24) & 1) << 0x14 | (uint)(uVar3 >> 0xd) & 0xfffff
                               ) * 0x10;
            for (dest = 0; (int)dest < 6; dest = dest + 1) {
              data[(long)(_mask + (ulong)(bytePos >> 3) + (long)(int)dest)] =
                   (Byte)((((ulong)(local_64 >> 4 & 0x100000) << 0x10 |
                           (ulong)(local_64 >> 4 & 0xfffff) << 0xd | uVar3 & 0xffffffee00001fff) <<
                           bVar4 | (long)((1 << bVar4) + -1) & instNorm) >>
                         ((byte)(dest << 3) & 0x3f));
            }
          }
        }
        bytePos = bytePos + 0x29;
      }
    }
    data_local = _mask;
  }
  return (SizeT)data_local;
}

Assistant:

static SizeT IA64_Convert(Byte *data, SizeT size, UInt32 ip, int encoding)
{
  SizeT i;
  if (size < 16)
    return 0;
  size -= 16;
  for (i = 0; i <= size; i += 16)
  {
    UInt32 instrTemplate = data[i] & 0x1F;
    UInt32 mask = kBranchTable[instrTemplate];
    UInt32 bitPos = 5;
    int slot;
    for (slot = 0; slot < 3; slot++, bitPos += 41)
    {
      UInt32 bytePos, bitRes;
      UInt64 instruction, instNorm;
      int j;
      if (((mask >> slot) & 1) == 0)
        continue;
      bytePos = (bitPos >> 3);
      bitRes = bitPos & 0x7;
      instruction = 0;
      for (j = 0; j < 6; j++)
        instruction += (UInt64)data[i + j + bytePos] << (8 * j);

      instNorm = instruction >> bitRes;
      if (((instNorm >> 37) & 0xF) == 0x5 && ((instNorm >> 9) & 0x7) == 0)
      {
        UInt32 src = (UInt32)((instNorm >> 13) & 0xFFFFF);
        UInt32 dest;
        src |= ((UInt32)(instNorm >> 36) & 1) << 20;
        
        src <<= 4;
        
        if (encoding)
          dest = ip + (UInt32)i + src;
        else
          dest = src - (ip + (UInt32)i);
        
        dest >>= 4;
        
        instNorm &= ~((UInt64)(0x8FFFFF) << 13);
        instNorm |= ((UInt64)(dest & 0xFFFFF) << 13);
        instNorm |= ((UInt64)(dest & 0x100000) << (36 - 20));
        
        instruction &= (1 << bitRes) - 1;
        instruction |= (instNorm << bitRes);
        for (j = 0; j < 6; j++)
          data[i + j + bytePos] = (Byte)(instruction >> (8 * j));
      }
    }
  }
  return i;
}